

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O3

int KINBBDPrecSetup(N_Vector uu,N_Vector uscale,N_Vector fval,N_Vector fscale,void *bbd_data)

{
  KINMem kin_mem;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  sunrealtype *psVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long j;
  long lVar19;
  long lVar20;
  long lVar21;
  char *msgfmt;
  bool bVar22;
  double dVar23;
  double dVar24;
  long local_78;
  
  kin_mem = *(KINMem *)((long)bbd_data + 0x90);
  iVar7 = SUNMatZero(*(undefined8 *)((long)bbd_data + 0x40));
  if (iVar7 == 0) {
    uVar1 = *(undefined8 *)((long)bbd_data + 0x60);
    uVar2 = *(undefined8 *)((long)bbd_data + 0x68);
    uVar3 = *(undefined8 *)((long)bbd_data + 0x70);
    lVar4 = *(long *)((long)bbd_data + 0x90);
    N_VScale(0x3ff0000000000000,uu,uVar3);
    lVar8 = N_VGetArrayPointer(uu);
    lVar9 = N_VGetArrayPointer(uscale);
    lVar10 = N_VGetArrayPointer(uVar1);
    lVar11 = N_VGetArrayPointer(uVar2);
    lVar12 = N_VGetArrayPointer(uVar3);
    if ((*(code **)((long)bbd_data + 0x30) == (code *)0x0) ||
       (iVar7 = (**(code **)((long)bbd_data + 0x30))
                          (*(undefined8 *)((long)bbd_data + 0x38),uu,*(undefined8 *)(lVar4 + 0x18)),
       iVar7 == 0)) {
      iVar7 = (**(code **)((long)bbd_data + 0x28))
                        (*(undefined8 *)((long)bbd_data + 0x38),uu,uVar1,
                         *(undefined8 *)(lVar4 + 0x18));
      *(long *)((long)bbd_data + 0x88) = *(long *)((long)bbd_data + 0x88) + 1;
      if (iVar7 == 0) {
        lVar5 = *bbd_data;
        lVar6 = *(long *)((long)bbd_data + 8);
        lVar17 = lVar6 + lVar5 + 1;
        lVar21 = *(long *)((long)bbd_data + 0x38);
        lVar19 = lVar21;
        if (lVar17 < lVar21) {
          lVar19 = lVar17;
        }
        if (0 < lVar19) {
          local_78 = 0;
          lVar13 = 1;
          do {
            j = lVar13 + -1;
            lVar14 = j;
            if (lVar13 <= lVar21) {
              do {
                dVar23 = ABS(*(double *)(lVar8 + lVar14 * 8));
                dVar24 = 1.0 / *(double *)(lVar9 + lVar14 * 8);
                if (dVar23 <= dVar24) {
                  dVar23 = dVar24;
                }
                *(double *)(lVar12 + lVar14 * 8) =
                     dVar23 * *(double *)((long)bbd_data + 0x20) + *(double *)(lVar12 + lVar14 * 8);
                lVar14 = lVar14 + lVar17;
              } while (lVar14 < lVar21);
            }
            iVar7 = (**(code **)((long)bbd_data + 0x28))
                              (lVar21,uVar3,uVar2,*(undefined8 *)(lVar4 + 0x18));
            *(long *)((long)bbd_data + 0x88) = *(long *)((long)bbd_data + 0x88) + 1;
            if (iVar7 != 0) goto LAB_0010dafa;
            lVar21 = *(long *)((long)bbd_data + 0x38);
            lVar14 = local_78;
            if (lVar13 <= lVar21) {
              do {
                *(undefined8 *)(lVar12 + j * 8) = *(undefined8 *)(lVar8 + j * 8);
                psVar15 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bbd_data + 0x40),j);
                lVar16 = j - *(long *)((long)bbd_data + 0x10);
                lVar20 = 0;
                if (0 < lVar16) {
                  lVar20 = lVar16;
                }
                lVar21 = *(long *)((long)bbd_data + 0x38);
                lVar18 = *(long *)((long)bbd_data + 0x18) + j;
                if (lVar21 + -1 <= lVar18) {
                  lVar18 = lVar21 + -1;
                }
                if (lVar20 <= lVar18) {
                  dVar24 = 1.0 / *(double *)(lVar9 + j * 8);
                  dVar23 = ABS(*(double *)(lVar8 + j * 8));
                  if (dVar23 <= dVar24) {
                    dVar23 = dVar24;
                  }
                  dVar24 = *(double *)((long)bbd_data + 0x20);
                  if (lVar16 < 1) {
                    lVar16 = 0;
                  }
                  lVar16 = lVar16 + -1;
                  do {
                    *(double *)((long)psVar15 + lVar16 * 8 + lVar14 + 8) =
                         (*(double *)(lVar11 + 8 + lVar16 * 8) -
                         *(double *)(lVar10 + 8 + lVar16 * 8)) * (1.0 / (dVar23 * dVar24));
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < lVar18);
                }
                j = j + lVar17;
                lVar14 = lVar14 + ~(lVar6 + lVar5) * 8;
              } while (j < lVar21);
            }
            local_78 = local_78 + -8;
            bVar22 = lVar13 != lVar19;
            lVar13 = lVar13 + 1;
          } while (bVar22);
        }
        iVar7 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bbd_data + 0x48),
                                    *(SUNMatrix *)((long)bbd_data + 0x40));
        return iVar7;
      }
    }
LAB_0010dafa:
    msgfmt = "The gloc or gcomm routine failed in an unrecoverable manner.";
    iVar7 = 0x1ab;
  }
  else {
    msgfmt = "An error arose from a SUNBandMatrix routine.";
    iVar7 = 0x1a2;
  }
  KINProcessError(kin_mem,-1,iVar7,"KINBBDPrecSetup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                  ,msgfmt);
  return -1;
}

Assistant:

static int KINBBDPrecSetup(N_Vector uu, N_Vector uscale,
                           SUNDIALS_MAYBE_UNUSED N_Vector fval,
                           SUNDIALS_MAYBE_UNUSED N_Vector fscale, void* bbd_data)
{
  KBBDPrecData pdata;
  KINMem kin_mem;
  int retval;

  pdata = (KBBDPrecData)bbd_data;

  kin_mem = (KINMem)pdata->kin_mem;

  /* Call KBBDDQJac for a new Jacobian calculation and store in PP */
  retval = SUNMatZero(pdata->PP);
  if (retval != 0)
  {
    KINProcessError(kin_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_SUNMAT_FAIL);
    return (-1);
  }

  retval = KBBDDQJac(pdata, uu, uscale, pdata->tempv1, pdata->tempv2,
                     pdata->tempv3);
  if (retval != 0)
  {
    KINProcessError(kin_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_FUNC_FAILED);
    return (-1);
  }

  /* Do LU factorization of P and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->PP);
  return (retval);
}